

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOWriter.cpp
# Opt level: O2

void __thiscall mognetwork::TcpASIOWriter::~TcpASIOWriter(TcpASIOWriter *this)

{
  _List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *this_00;
  
  (this->super_IRunnable)._vptr_IRunnable = (_func_int **)&PTR__TcpASIOWriter_00114c10;
  if (this->m_server == (TcpASIOServer *)0x0) {
    if (this->m_mutex != (Mutex *)0x0) {
      (*this->m_mutex->_vptr_Mutex[1])();
    }
    this_00 = &this->m_socketList->
               super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>;
    if (this_00 !=
        (_List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x0) {
      std::__cxx11::_List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::
      _M_clear(this_00);
      operator_delete(this_00);
    }
  }
  if (this->m_thread != (Thread *)0x0) {
    (*this->m_thread->_vptr_Thread[1])();
  }
  CondVar::~CondVar(&this->m_condVar);
  Selector::~Selector(&this->m_selector);
  return;
}

Assistant:

TcpASIOWriter::~TcpASIOWriter()
  {
    if (m_server == NULL) {
      if (m_mutex != NULL)
	delete (m_mutex);
      if (m_socketList != NULL)
	delete (m_socketList);
    }
    delete (m_thread);
  }